

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printAssociativeContainer<QMultiMap<QSsl::AlternativeNameEntryType,QString>>
          (QtPrivate *this,QDebug debug,char *which,
          QMultiMap<QSsl::AlternativeNameEntryType,_QString> *c)

{
  long lVar1;
  undefined8 uVar2;
  QDebug *pQVar3;
  QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>
  *pQVar4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  long in_FS_OFFSET;
  QDebug local_50;
  undefined1 local_48 [8];
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(*(long *)debug.stream + 0x30) = 0;
  pQVar3 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar3,"(");
  pQVar4 = (c->d).d.ptr;
  if (pQVar4 == (QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>
                 *)0x0) {
    p_Var5 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var5 = *(_Rb_tree_node_base **)(pQVar4 + 0x20);
  }
  while( true ) {
    p_Var6 = (_Rb_tree_node_base *)(pQVar4 + 0x10);
    if (pQVar4 == (QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>
                   *)0x0) {
      p_Var6 = (_Rb_tree_node_base *)0x0;
    }
    if (p_Var5 == p_Var6) break;
    pQVar3 = QDebug::operator<<((QDebug *)debug.stream,'(');
    local_50.stream = pQVar3->stream;
    *(int *)(local_50.stream + 0x28) = *(int *)(local_50.stream + 0x28) + 1;
    ::operator<<((Stream *)local_48,(AlternativeNameEntryType)&local_50);
    pQVar3 = QDebug::operator<<((QDebug *)local_48,", ");
    pQVar3 = QDebug::operator<<(pQVar3,(QString *)&p_Var5[1]._M_parent);
    QDebug::operator<<(pQVar3,')');
    QDebug::~QDebug((QDebug *)local_48);
    QDebug::~QDebug(&local_50);
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    pQVar4 = (c->d).d.ptr;
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  uVar2 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printAssociativeContainer(QDebug debug, const char *which, const AssociativeContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << "(";
    for (typename AssociativeContainer::const_iterator it = c.constBegin();
         it != c.constEnd(); ++it) {
        debug << '(' << it.key() << ", " << it.value() << ')';
    }
    debug << ')';
    return debug;
}